

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidArgsortWrongAxis(void)

{
  RepeatedField<long> *pRVar1;
  bool bVar2;
  int iVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  TypeUnion this;
  Type *this_00;
  Type *pTVar8;
  LayerUnion this_01;
  ostream *poVar9;
  string *psVar10;
  long lVar11;
  Rep *pRVar12;
  int iVar13;
  int iVar14;
  Result res;
  Model m;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  undefined1 local_90 [24];
  Model local_78;
  pointer local_48;
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  CoreML::Specification::Model::Model(&local_78);
  if (local_78.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_78.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_78.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_a0 = (undefined1  [8])local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_a0);
  if (local_a0 != (undefined1  [8])local_90) {
    operator_delete((void *)local_a0,local_90._0_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pRVar1 = &pAVar7->shape_;
  iVar14 = (pAVar7->shape_).current_size_;
  iVar13 = (pAVar7->shape_).total_size_;
  if (iVar14 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 1);
    iVar14 = (pAVar7->shape_).current_size_;
    iVar13 = (pAVar7->shape_).total_size_;
  }
  pRVar12 = (pAVar7->shape_).rep_;
  iVar3 = iVar14 + 1;
  (pAVar7->shape_).current_size_ = iVar3;
  pRVar12->elements[iVar14] = 3;
  if (iVar3 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 2);
    iVar3 = (pAVar7->shape_).current_size_;
    iVar13 = (pAVar7->shape_).total_size_;
    pRVar12 = (pAVar7->shape_).rep_;
  }
  iVar14 = iVar3 + 1;
  pRVar1->current_size_ = iVar14;
  pRVar12->elements[iVar3] = 5;
  if (iVar14 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar3 + 2);
    iVar14 = (pAVar7->shape_).current_size_;
    pRVar12 = (pAVar7->shape_).rep_;
  }
  pRVar1->current_size_ = iVar14 + 1;
  pRVar12->elements[iVar14] = 2;
  if (local_78.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_78.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_78.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_a0 = (undefined1  [8])local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_a0);
  if (local_a0 != (undefined1  [8])local_90) {
    operator_delete((void *)local_a0,local_90._0_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pRVar1 = &pAVar7->shape_;
  iVar14 = (pAVar7->shape_).current_size_;
  iVar13 = (pAVar7->shape_).total_size_;
  if (iVar14 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 1);
    iVar14 = (pAVar7->shape_).current_size_;
    iVar13 = (pAVar7->shape_).total_size_;
  }
  pRVar12 = (pAVar7->shape_).rep_;
  iVar3 = iVar14 + 1;
  (pAVar7->shape_).current_size_ = iVar3;
  pRVar12->elements[iVar14] = 3;
  if (iVar3 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 2);
    iVar3 = (pAVar7->shape_).current_size_;
    iVar13 = (pAVar7->shape_).total_size_;
    pRVar12 = (pAVar7->shape_).rep_;
  }
  iVar14 = iVar3 + 1;
  pRVar1->current_size_ = iVar14;
  pRVar12->elements[iVar3] = 5;
  if (iVar14 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar3 + 2);
    iVar14 = (pAVar7->shape_).current_size_;
    pRVar12 = (pAVar7->shape_).rep_;
  }
  pRVar1->current_size_ = iVar14 + 1;
  pRVar12->elements[iVar14] = 2;
  if (local_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_78);
    local_78._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_78.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  (local_78.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_78.Type_.pipeline_)->models_,(Type *)0x0);
  local_a0 = (undefined1  [8])local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"argsort","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_00->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_a0);
  if (local_a0 != (undefined1  [8])local_90) {
    operator_delete((void *)local_a0,local_90._0_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                     (&(this_00->inputtensor_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar8->rank_ = 3;
  if (this_00->_oneof_case_[0] == 0x5b5) {
    this_01 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x5b5;
    this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    CoreML::Specification::ArgSortLayerParams::ArgSortLayerParams(this_01.argsort_);
    (this_00->layer_).argsort_ = (ArgSortLayerParams *)this_01;
  }
  (this_01.activation_)->NonlinearityType_ = (NonlinearityTypeUnion)0xffffffffffffffff;
  CoreML::validate<(MLModelType)500>((Result *)local_a0,&local_78);
  bVar2 = CoreML::Result::good((Result *)local_a0);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1752);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  }
  else {
    psVar10 = CoreML::Result::message_abi_cxx11_((Result *)local_a0);
    lVar11 = std::__cxx11::string::find((char *)psVar10,0x2f27e4,0);
    if (lVar11 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                 ,0x6c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1753);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"res.message().find(\"axis\") != std::string::npos",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    }
    else {
      (this_01.activation_)->NonlinearityType_ = (NonlinearityTypeUnion)0x3;
      CoreML::validate<(MLModelType)500>((Result *)&local_48,&local_78);
      local_a0 = (undefined1  [8])local_48;
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_p != &local_30) {
        operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
      }
      bVar2 = CoreML::Result::good((Result *)local_a0);
      if (bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1758);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res).good())",0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      }
      else {
        psVar10 = CoreML::Result::message_abi_cxx11_((Result *)local_a0);
        iVar14 = 0;
        lVar11 = std::__cxx11::string::find((char *)psVar10,0x2f27e4,0);
        if (lVar11 != -1) goto LAB_0018cee7;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1759);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"res.message().find(\"axis\") != std::string::npos",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      }
    }
  }
  std::ostream::put((char)poVar9);
  iVar14 = 1;
  std::ostream::flush();
LAB_0018cee7:
  if (local_98._M_p != local_90 + 8) {
    operator_delete(local_98._M_p,local_90._8_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_78);
  return iVar14;
}

Assistant:

int testInvalidArgsortWrongAxis() {

    // axis can't be negative or larger than equal to input rank

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->set_name("argsort");
    layers->add_input("input");
    layers->add_output("output");
    layers->add_inputtensor()->set_rank(3);

    auto *params = layers->mutable_argsort();

    // CASE 1: negative axis
    params->set_axis(-1);

    // axis should be in range [0, rank)
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("axis") != std::string::npos);

    // CASE 2: axis greater than equal to input rank
    params->set_axis(3);
    res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("axis") != std::string::npos);

    return 0;
}